

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O2

void __thiscall
argparse::ArgumentParser::ArgumentParser(ArgumentParser *this,string *aProgramName,string *aVersion)

{
  _Rb_tree_header *p_Var1;
  Argument *pAVar2;
  allocator<char> local_79 [9];
  string local_70 [32];
  string local_50 [32];
  
  std::__cxx11::string::string((string *)this,(string *)aProgramName);
  std::__cxx11::string::string((string *)&this->mVersion,(string *)aVersion);
  (this->mDescription)._M_dataplus._M_p = (pointer)&(this->mDescription).field_2;
  (this->mDescription)._M_string_length = 0;
  (this->mDescription).field_2._M_local_buf[0] = '\0';
  (this->mEpilog)._M_dataplus._M_p = (pointer)&(this->mEpilog).field_2;
  (this->mEpilog)._M_string_length = 0;
  (this->mEpilog).field_2._M_local_buf[0] = '\0';
  (this->mPositionalArguments).
  super__List_base<argparse::Argument,_std::allocator<argparse::Argument>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&this->mPositionalArguments;
  (this->mPositionalArguments).
  super__List_base<argparse::Argument,_std::allocator<argparse::Argument>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&this->mPositionalArguments;
  (this->mPositionalArguments).
  super__List_base<argparse::Argument,_std::allocator<argparse::Argument>_>._M_impl._M_node._M_size
       = 0;
  (this->mOptionalArguments).
  super__List_base<argparse::Argument,_std::allocator<argparse::Argument>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&this->mOptionalArguments;
  (this->mOptionalArguments).
  super__List_base<argparse::Argument,_std::allocator<argparse::Argument>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&this->mOptionalArguments;
  (this->mOptionalArguments).
  super__List_base<argparse::Argument,_std::allocator<argparse::Argument>_>._M_impl._M_node._M_size
       = 0;
  p_Var1 = &(this->mArgumentMap)._M_t._M_impl.super__Rb_tree_header;
  (this->mArgumentMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mArgumentMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mArgumentMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mArgumentMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->mArgumentMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pAVar2 = add_argument<char_const*,char_const*>(this,"-h","--help");
  std::__cxx11::string::string<std::allocator<char>>
            (local_50,"shows help message and exits",local_79);
  std::__cxx11::string::operator=((string *)&pAVar2->mHelp,local_50);
  pAVar2->mNumArgs = 0;
  std::__cxx11::string::~string(local_50);
  pAVar2 = add_argument<char_const*,char_const*>(this,"-v","--version");
  std::__cxx11::string::string<std::allocator<char>>
            (local_70,"prints version information and exits",local_79);
  std::__cxx11::string::operator=((string *)&pAVar2->mHelp,local_70);
  pAVar2->mNumArgs = 0;
  std::__cxx11::string::~string(local_70);
  return;
}

Assistant:

explicit ArgumentParser(std::string aProgramName = {}, std::string aVersion = "1.0")
      : mProgramName(std::move(aProgramName)), mVersion(std::move(aVersion)) {
    add_argument("-h", "--help")
        .help("shows help message and exits")
        .nargs(0);
    add_argument("-v", "--version")
        .help("prints version information and exits")
        .nargs(0);
  }